

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

BatchnormLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_batchnorm(NeuralNetworkLayer *this)

{
  ulong uVar1;
  BatchnormLayerParams *pBVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0xa0) {
    clear_layer(this);
    this->_oneof_case_[0] = 0xa0;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pBVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::BatchnormLayerParams>(arena);
    (this->layer_).batchnorm_ = pBVar2;
  }
  return (BatchnormLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::BatchnormLayerParams* NeuralNetworkLayer::_internal_mutable_batchnorm() {
  if (!_internal_has_batchnorm()) {
    clear_layer();
    set_has_batchnorm();
    layer_.batchnorm_ = CreateMaybeMessage< ::CoreML::Specification::BatchnormLayerParams >(GetArenaForAllocation());
  }
  return layer_.batchnorm_;
}